

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O2

void __thiscall
mocker::LoopInvariantCodeMotion::hoist
          (LoopInvariantCodeMotion *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *loopNodes,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *invariant,size_t preHeader)

{
  _List_node_base *this_00;
  bool bVar1;
  BasicBlock *this_01;
  BasicBlock *pBVar2;
  ostream *poVar3;
  shared_ptr<mocker::ir::IRInst> *inst;
  _List_node_base *p_Var4;
  __node_base *p_Var5;
  __shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  this_01 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,preHeader);
  p_Var5 = &(loopNodes->_M_h)._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    pBVar2 = ir::FunctionModule::getMutableBasicBlock
                       ((this->super_FuncPass).func,(size_t)p_Var5[1]._M_nxt);
    p_Var4 = (_List_node_base *)&pBVar2->insts;
    while (p_Var4 = (((_List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)&pBVar2->insts) {
      local_50._M_dataplus._M_p = (pointer)p_Var4[1]._M_next;
      bVar1 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                        (invariant,(unsigned_long *)&local_50);
      if (bVar1) {
        this_00 = p_Var4 + 1;
        poVar3 = std::operator<<((ostream *)&std::cerr,"hoist: ");
        ir::fmtInst_abi_cxx11_(&local_50,(ir *)this_00,inst);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,(__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)this_00
                  );
        ir::BasicBlock::appendInstBeforeTerminator
                  (this_01,(shared_ptr<mocker::ir::IRInst> *)&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::make_shared<mocker::ir::Deleted>();
        std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<mocker::ir::Deleted,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      }
    }
  }
  removeDeletedInsts((this->super_FuncPass).func);
  return;
}

Assistant:

void LoopInvariantCodeMotion::hoist(
    const std::unordered_set<std::size_t> &loopNodes,
    const std::unordered_set<ir::InstID> &invariant, std::size_t preHeader) {
  auto &preHeaderBB = func.getMutableBasicBlock(preHeader);
  for (auto node : loopNodes) {
    auto &bb = func.getMutableBasicBlock(node);
    for (auto &inst : bb.getMutableInsts()) {
      if (!isIn(invariant, inst->getID()))
        continue;
      std::cerr << "hoist: " << ir::fmtInst(inst) << std::endl;
      preHeaderBB.appendInstBeforeTerminator(inst);
      inst = std::make_shared<ir::Deleted>();
    }
  }
  removeDeletedInsts(func);
}